

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O3

void __thiscall IRT::TreePattern::~TreePattern(TreePattern *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this->_vptr_TreePattern = (_func_int **)&PTR__TreePattern_00181c88;
  pcVar1 = (this->stringRepresentation)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->stringRepresentation).field_2) {
    operator_delete(pcVar1);
  }
  this_00 = (this->treeRepresentation).super___shared_ptr<IRT::INode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

IRT::TreePattern::~TreePattern( ) {
}